

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_5a2f::Tables::Tables(Tables *this)

{
  Bitvec16x16 *pBVar1;
  undefined4 *puVar2;
  byte bVar3;
  Bitvec16x16 *in_RDI;
  int i_2;
  int j_1;
  int i_1;
  int j;
  Cells16 *mask;
  uint32_t value;
  int i;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<int> *__range2;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined4 in_stack_fffffffffffffcac;
  uint16_t in_stack_fffffffffffffcc6;
  Bitvec16x16 *local_2a8;
  Bitvec16x16 *local_290;
  Bitvec16x16 *local_278;
  Bitvec16x16 *local_230;
  Bitvec16x16 *local_210;
  Bitvec16x16 *local_1f8;
  BoxIndexing local_1ea;
  int local_1e4;
  Bitvec16x16 local_1e0;
  Bitvec16x16 local_1c0;
  Bitvec16x16 local_1a0;
  int local_16c;
  int local_168;
  int local_164;
  Bitvec16x16 *local_160;
  uint local_158;
  int local_154;
  const_iterator local_150;
  const_iterator local_148;
  int local_13c [9];
  initializer_list<int> local_118;
  initializer_list<int> *local_108;
  Bitvec08x16 local_100;
  Bitvec08x16 local_f0;
  Bitvec08x16 local_e0;
  Bitvec08x16 local_d0;
  Bitvec08x16 local_c0;
  Bitvec08x16 local_b0;
  Bitvec08x16 local_a0;
  Bitvec08x16 local_90;
  Bitvec08x16 local_80;
  Bitvec08x16 local_70;
  Bitvec08x16 local_60;
  Bitvec08x16 local_50 [4];
  
  local_1f8 = in_RDI;
  do {
    local_210 = local_1f8;
    do {
      Bitvec16x16::Bitvec16x16(local_210);
      local_210 = local_210 + 1;
    } while (local_210 != local_1f8 + 0x10);
    local_1f8 = local_1f8 + 0x10;
  } while (local_1f8 != in_RDI + 0x90);
  Bitvec08x16::Bitvec08x16((Bitvec08x16 *)(in_RDI + 0x90),0,0x1ff,0x1ff,0x1ff,0,0x1ff,0,0);
  Bitvec08x16::Bitvec08x16((Bitvec08x16 *)(in_RDI[0x90].vec + 2),0x1ff,0,0x1ff,0x1ff,0x1ff,0,0,0);
  Bitvec08x16::Bitvec08x16((Bitvec08x16 *)(in_RDI + 0x91),0x1ff,0x1ff,0,0,0x1ff,0x1ff,0,0);
  Bitvec08x16::Bitvec08x16((Bitvec08x16 *)(in_RDI[0x91].vec + 2),0,0,0,0,0,0,0,0);
  Bitvec08x16::Bitvec08x16((Bitvec08x16 *)(in_RDI + 0x92),0x1ff,0x1ff,0,0x1ff,0x1ff,0,0,0);
  Bitvec08x16::Bitvec08x16((Bitvec08x16 *)(in_RDI[0x92].vec + 2),0,0x1ff,0x1ff,0,0x1ff,0x1ff,0,0);
  Bitvec08x16::Bitvec08x16((Bitvec08x16 *)(in_RDI + 0x93),0x1ff,0,0x1ff,0x1ff,0,0x1ff,0,0);
  Bitvec08x16::Bitvec08x16((Bitvec08x16 *)(in_RDI[0x93].vec + 2),0,0,0,0,0,0,0,0);
  Bitvec08x16::Bitvec08x16((Bitvec08x16 *)(in_RDI + 0x94),0x1ff,0,0x1ff,0,0x1ff,0x1ff,0,0);
  Bitvec08x16::Bitvec08x16((Bitvec08x16 *)(in_RDI[0x94].vec + 2),0x1ff,0x1ff,0,0x1ff,0,0x1ff,0,0);
  Bitvec08x16::Bitvec08x16((Bitvec08x16 *)(in_RDI + 0x95),0,0x1ff,0x1ff,0x1ff,0x1ff,0,0,0);
  Bitvec08x16::Bitvec08x16((Bitvec08x16 *)(in_RDI[0x95].vec + 2),0,0,0,0,0,0,0,0);
  Bitvec08x16::Bitvec08x16
            ((Bitvec08x16 *)(in_RDI + 0x96),0x908,0xb0a,0xd0c,0xd0c,0x908,0xb0a,0xffff,0xffff);
  Bitvec08x16::Bitvec08x16
            ((Bitvec08x16 *)(in_RDI[0x96].vec + 2),0xb0a,0xd0c,0x908,0xb0a,0xd0c,0x908,0xffff,0xffff
            );
  Bitvec08x16::Bitvec08x16
            ((Bitvec08x16 *)(in_RDI + 0x97),0xd0c,0x908,0xb0a,0x908,0xb0a,0xd0c,0xffff,0xffff);
  Bitvec08x16::Bitvec08x16
            ((Bitvec08x16 *)(in_RDI[0x97].vec + 2),0xb0a,0xd0c,0x908,0x908,0xb0a,0xd0c,0xffff,0xffff
            );
  Bitvec08x16::Bitvec08x16
            ((Bitvec08x16 *)(in_RDI + 0x98),0xd0c,0x908,0xb0a,0xd0c,0x908,0xb0a,0xffff,0xffff);
  Bitvec08x16::Bitvec08x16
            ((Bitvec08x16 *)(in_RDI[0x98].vec + 2),0x908,0xb0a,0xd0c,0xb0a,0xd0c,0x908,0xffff,0xffff
            );
  Bitvec08x16::Bitvec08x16
            ((Bitvec08x16 *)(in_RDI + 0x99),0xd0c,0x908,0xb0a,0xb0a,0xd0c,0x908,0xffff,0xffff);
  Bitvec08x16::Bitvec08x16
            ((Bitvec08x16 *)(in_RDI[0x99].vec + 2),0x908,0xb0a,0xd0c,0x908,0xb0a,0xd0c,0xffff,0xffff
            );
  Bitvec08x16::Bitvec08x16
            ((Bitvec08x16 *)(in_RDI + 0x9a),0xb0a,0xd0c,0x908,0xd0c,0x908,0xb0a,0xffff,0xffff);
  local_230 = in_RDI + 0x9b;
  do {
    Bitvec16x16::Bitvec16x16(local_230);
    local_230 = local_230 + 1;
  } while (local_230 != in_RDI + 0xa4);
  local_278 = in_RDI + 0xa4;
  do {
    Bitvec16x16::Bitvec16x16(local_278);
    local_278 = local_278 + 1;
  } while (local_278 != in_RDI + 0xad);
  local_290 = in_RDI + 0xad;
  do {
    Bitvec16x16::Bitvec16x16(local_290);
    local_290 = local_290 + 1;
  } while (local_290 != in_RDI + 0xb6);
  Bitvec08x16::Bitvec08x16(local_50,0x100,0x302,0x504,0xffff,0x504,0x100,0x302,0xffff);
  Bitvec08x16::Bitvec08x16(&local_60,0x302,0x504,0x100,0xffff,0xffff,0xffff,0xffff,0xffff);
  Bitvec16x16::Bitvec16x16(in_RDI + 0xb6,local_50,&local_60);
  Bitvec08x16::Bitvec08x16(&local_70,0x908,0xb0a,0x706,0xffff,0xb0a,0x706,0x908,0xffff);
  Bitvec08x16::Bitvec08x16(&local_80,0x706,0x908,0xb0a,0xffff,0xffff,0xffff,0xffff,0xffff);
  Bitvec16x16::Bitvec16x16(in_RDI + 0xb7,&local_70,&local_80);
  Bitvec08x16::Bitvec08x16(&local_90,0x100,0x100,0x100,0x302,0x302,0x302,0x302,0x504);
  Bitvec08x16::Bitvec08x16(&local_a0,0x504,0x504,0x504,0x100,0x706,0x706,0x706,0x706);
  Bitvec16x16::Bitvec16x16(in_RDI + 0xb8,&local_90,&local_a0);
  Bitvec08x16::Bitvec08x16(&local_b0,0x100,0x100,0x100,0x504,0x302,0x302,0x302,0x100);
  Bitvec08x16::Bitvec08x16(&local_c0,0x504,0x504,0x504,0x302,0x706,0x706,0x706,0x706);
  Bitvec16x16::Bitvec16x16(in_RDI + 0xb9,&local_b0,&local_c0);
  Bitvec08x16::Bitvec08x16(&local_d0,0x100,0x302,0x504,0x706,0x100,0x302,0x504,0x706);
  Bitvec08x16::Bitvec08x16(&local_e0,0x100,0x302,0x504,0x706,0x302,0x504,0x100,0x706);
  Bitvec16x16::Bitvec16x16(in_RDI + 0xba,&local_d0,&local_e0);
  Bitvec08x16::Bitvec08x16(&local_f0,0x100,0x302,0x504,0x706,0x100,0x302,0x504,0x706);
  Bitvec08x16::Bitvec08x16(&local_100,0x100,0x302,0x504,0x706,0x504,0x100,0x302,0x706);
  Bitvec16x16::Bitvec16x16(in_RDI + 0xbb,&local_f0,&local_100);
  Bitvec16x16::Bitvec16x16();
  Bitvec16x16::Bitvec16x16();
  uVar4 = 0xb0a;
  uVar5 = 0;
  Bitvec16x16::Bitvec16x16();
  Bitvec08x16::All(in_stack_fffffffffffffcc6);
  Bitvec08x16::All(in_stack_fffffffffffffcc6);
  Bitvec08x16::All(in_stack_fffffffffffffcc6);
  Bitvec08x16::All(in_stack_fffffffffffffcc6);
  Bitvec08x16::All(in_stack_fffffffffffffcc6);
  Bitvec08x16::All(in_stack_fffffffffffffcc6);
  Bitvec08x16::All(in_stack_fffffffffffffcc6);
  Bitvec08x16::All(in_stack_fffffffffffffcc6);
  Bitvec08x16::All(in_stack_fffffffffffffcc6);
  memcpy(in_RDI[0xc3].vec + 2,&DAT_00118970,0x48);
  memcpy(in_RDI[0xc5].vec + 3,&DAT_001189b8,0x24);
  memcpy((void *)((long)in_RDI[0xc6].vec + 0x1c),&DAT_001189dc,0x24);
  local_2a8 = in_RDI + 200;
  do {
    memset(local_2a8,0,6);
    local_2a8 = (Bitvec16x16 *)((long)local_2a8->vec + 6);
  } while (local_2a8 != (Bitvec16x16 *)((long)in_RDI[0xd7].vec + 6));
  memcpy(local_13c,&DAT_00118a00,0x24);
  local_118._M_array = local_13c;
  local_118._M_len = 9;
  local_108 = &local_118;
  local_148 = std::initializer_list<int>::begin(local_108);
  local_150 = std::initializer_list<int>::end
                        ((initializer_list<int> *)
                         CONCAT44(in_stack_fffffffffffffcac,CONCAT22(uVar5,uVar4)));
  for (; local_148 != local_150; local_148 = local_148 + 1) {
    local_154 = *local_148;
    for (local_158 = 0; local_158 < 9; local_158 = local_158 + 1) {
      local_160 = in_RDI + (ulong)local_158 * 0x10 + (long)local_154;
      for (local_164 = 0; local_164 < 0xf; local_164 = local_164 + 1) {
        bVar3 = (byte)local_158;
        if (local_164 == local_154) {
          Bitvec16x16::Insert(local_160,local_164,(ushort)(1 << (bVar3 & 0x1f)) ^ 0x1ff);
        }
        else if ((local_164 / 4 < 3) && (local_164 % 4 < 3)) {
          Bitvec16x16::Insert(local_160,local_164,(uint16_t)(1 << (bVar3 & 0x1f)));
        }
        else if ((local_164 / 4 == local_154 / 4) || (local_164 % 4 == local_154 % 4)) {
          Bitvec16x16::Insert(local_160,local_164,(uint16_t)(1 << (bVar3 & 0x1f)));
        }
      }
    }
  }
  for (local_168 = 0; local_168 < 3; local_168 = local_168 + 1) {
    for (local_16c = 0; local_16c < 3; local_16c = local_16c + 1) {
      Bitvec16x16::Bitvec16x16
                (&local_1a0,(Bitvec08x16 *)(in_RDI[0x96].vec + (long)local_168 * 2),
                 (Bitvec08x16 *)(in_RDI[0x96].vec + (long)local_16c * 2));
      pBVar1 = in_RDI + (long)(local_168 * 3 + local_16c) + 0x9b;
      pBVar1->vec[0] = local_1a0.vec[0];
      pBVar1->vec[1] = local_1a0.vec[1];
      pBVar1->vec[2] = local_1a0.vec[2];
      pBVar1->vec[3] = local_1a0.vec[3];
      Bitvec16x16::Bitvec16x16
                (&local_1c0,(Bitvec08x16 *)(in_RDI[0x97].vec + (long)local_168 * 2 + 2),
                 (Bitvec08x16 *)(in_RDI[0x97].vec + (long)local_16c * 2 + 2));
      pBVar1 = in_RDI + (long)(local_168 * 3 + local_16c) + 0xa4;
      pBVar1->vec[0] = local_1c0.vec[0];
      pBVar1->vec[1] = local_1c0.vec[1];
      pBVar1->vec[2] = local_1c0.vec[2];
      pBVar1->vec[3] = local_1c0.vec[3];
      Bitvec16x16::Bitvec16x16
                (&local_1e0,(Bitvec08x16 *)(in_RDI[0x99].vec + (long)local_168 * 2),
                 (Bitvec08x16 *)(in_RDI[0x99].vec + (long)local_16c * 2));
      pBVar1 = in_RDI + (long)(local_168 * 3 + local_16c) + 0xad;
      pBVar1->vec[0] = local_1e0.vec[0];
      pBVar1->vec[1] = local_1e0.vec[1];
      pBVar1->vec[2] = local_1e0.vec[2];
      pBVar1->vec[3] = local_1e0.vec[3];
    }
  }
  for (local_1e4 = 0; local_1e4 < 0x51; local_1e4 = local_1e4 + 1) {
    BoxIndexing::BoxIndexing(&local_1ea,local_1e4);
    puVar2 = (undefined4 *)((long)in_RDI[200].vec + (long)local_1e4 * 6);
    *puVar2 = local_1ea._0_4_;
    *(undefined2 *)(puVar2 + 1) = local_1ea._4_2_;
  }
  return;
}

Assistant:

Tables() noexcept {
        for (int i : {0, 1, 2, 4, 5, 6, 8, 9, 10}) {  // only need for cells, not triads
            for (uint32_t value = 0; value < 9; value++) {
                Cells16 &mask = cell_assignment_eliminations[value][i];
                for (int j = 0; j < 15; j++) {
                    if (j == i) { // asserted cell: clear all bits but the one asserted
                        mask.Insert(j, kAll ^ (1u << value));
                    } else if (j / 4 < 3 && j % 4 < 3) { // conflict cell: clear the asserted bit
                        mask.Insert(j, 1u << value);
                    } else if (j / 4 == i / 4 || j % 4 == i % 4) { // clear 2 negative triads
                        mask.Insert(j, 1u << value);
                    }
                }
            }
        }
        for (int i = 0; i < 3; i++) {
            for (int j = 0; j < 3; j++) {
                triads_shift0_to_config_elims16[i * 3 + j] =
                        Cells16{triads_shift0_to_config_elims[i],triads_shift0_to_config_elims[j]};
                triads_shift1_to_config_elims16[i * 3 + j] =
                        Cells16{triads_shift1_to_config_elims[i],triads_shift1_to_config_elims[j]};
                triads_shift2_to_config_elims16[i * 3 + j] =
                        Cells16{triads_shift2_to_config_elims[i],triads_shift2_to_config_elims[j]};
            }
        }
        for (int i = 0; i < 81; i++) box_indexing[i] = BoxIndexing{i};
    }